

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lexer.cpp
# Opt level: O0

void __thiscall
slang::parsing::Lexer::Lexer
          (Lexer *this,BufferID bufferId,string_view source,char *startPtr,BumpAllocator *alloc,
          Diagnostics *diagnostics,SourceManager *sourceManager,LexerOptions *options)

{
  char *pcVar1;
  const_pointer pvVar2;
  size_type sVar3;
  long lVar4;
  uint32_t in_ESI;
  Lexer *in_RDI;
  char *in_R8;
  BumpAllocator *in_R9;
  Diagnostics *in_stack_00000008;
  SourceManager *in_stack_00000010;
  uchar *ubuf;
  ptrdiff_t count;
  LexerOptions *in_stack_ffffffffffffff78;
  SmallVector<slang::parsing::Trivia,_32UL> *offset;
  Lexer *this_00;
  basic_string_view<char,_std::char_traits<char>_> local_18;
  uint32_t local_4;
  
  in_RDI->alloc = in_R9;
  in_RDI->diagnostics = in_stack_00000008;
  local_4 = in_ESI;
  LexerOptions::LexerOptions(&in_RDI->options,in_stack_ffffffffffffff78);
  (in_RDI->bufferId).id = local_4;
  pvVar2 = std::basic_string_view<char,_std::char_traits<char>_>::data(&local_18);
  in_RDI->originalBegin = pvVar2;
  in_RDI->sourceBuffer = in_R8;
  pvVar2 = std::basic_string_view<char,_std::char_traits<char>_>::data(&local_18);
  sVar3 = std::basic_string_view<char,_std::char_traits<char>_>::length(&local_18);
  in_RDI->sourceEnd = pvVar2 + sVar3;
  in_RDI->marker = (char *)0x0;
  in_RDI->errorCount = 0;
  offset = &in_RDI->triviaBuffer;
  SmallVector<slang::parsing::Trivia,_32UL>::SmallVector
            ((SmallVector<slang::parsing::Trivia,_32UL> *)0x87e778);
  this_00 = (Lexer *)&in_RDI->stringBuffer;
  SmallVector<char,_40UL>::SmallVector((SmallVector<char,_40UL> *)0x87e78e);
  in_RDI->library = (SourceLibrary *)0x0;
  in_RDI->sourceManager = in_stack_00000010;
  lVar4 = (long)in_RDI->sourceEnd - (long)in_RDI->sourceBuffer;
  if (1 < lVar4) {
    pcVar1 = in_RDI->sourceBuffer;
    if (((*pcVar1 == -1) && (pcVar1[1] == -2)) || ((*pcVar1 == -2 && (pcVar1[1] == -1)))) {
      in_RDI->errorCount = in_RDI->errorCount + 1;
      addDiag(this_00,SUB84((ulong)in_RDI >> 0x20,0),(size_t)offset);
      advance(in_RDI,2);
    }
    else if ((((2 < lVar4) && (*pcVar1 == -0x11)) && (pcVar1[1] == -0x45)) && (pcVar1[2] == -0x41))
    {
      advance(in_RDI,3);
    }
  }
  return;
}

Assistant:

Lexer::Lexer(BufferID bufferId, std::string_view source, const char* startPtr, BumpAllocator& alloc,
             Diagnostics& diagnostics, SourceManager& sourceManager, LexerOptions options) :
    alloc(alloc), diagnostics(diagnostics), options(std::move(options)), bufferId(bufferId),
    originalBegin(source.data()), sourceBuffer(startPtr),
    sourceEnd(source.data() + source.length()), marker(nullptr), sourceManager(sourceManager) {

    ptrdiff_t count = sourceEnd - sourceBuffer;
    SLANG_ASSERT(count);
    SLANG_ASSERT(sourceEnd[-1] == '\0');

    // detect BOMs so we can give nice errors for invalid encoding
    if (count >= 2) {
        const unsigned char* ubuf = reinterpret_cast<const unsigned char*>(sourceBuffer);
        if ((ubuf[0] == 0xFF && ubuf[1] == 0xFE) || (ubuf[0] == 0xFE && ubuf[1] == 0xFF)) {
            errorCount++;
            addDiag(diag::UnicodeBOM, 0);
            advance(2);
        }
        else if (count >= 3) {
            // Silently skip the UTF8 BOM.
            if (ubuf[0] == 0xEF && ubuf[1] == 0xBB && ubuf[2] == 0xBF)
                advance(3);
        }
    }
}